

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fread.c
# Opt level: O0

size_t fread(void *__ptr,size_t __size,size_t __n,FILE *__stream)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int local_4c;
  ulong local_48;
  size_t size_i;
  size_t nmemb_i;
  char *dest;
  _PDCLIB_file_t *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  size_i = 0;
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  iVar3 = _PDCLIB_prepread((_PDCLIB_file_t *)__stream);
  if (iVar3 != -1) {
    for (size_i = 0; size_i < __n; size_i = size_i + 1) {
      for (local_48 = 0; local_48 < __size; local_48 = local_48 + 1) {
        if ((__stream->_IO_read_base == __stream->_IO_write_base) &&
           (__stream->_IO_buf_base == (char *)0x0)) {
          local_4c = _PDCLIB_fillbuffer((_PDCLIB_file_t *)__stream);
        }
        else {
          local_4c = 0;
        }
        if (local_4c == -1) {
          mtx_unlock((mtx_t *)&__stream->_IO_save_base);
          return size_i;
        }
        if (__stream->_IO_buf_base == (char *)0x0) {
          pcVar2 = __stream->_IO_read_base;
          __stream->_IO_read_base = pcVar2 + 1;
          cVar1 = __stream->_IO_read_ptr[(long)pcVar2];
        }
        else {
          pcVar2 = __stream->_IO_buf_base;
          __stream->_IO_buf_base = pcVar2 + -1;
          cVar1 = ((undefined1 *)((long)&__stream->_IO_buf_base + 7))[(long)pcVar2];
        }
        *(char *)((long)__ptr + size_i * __size + local_48) = cVar1;
      }
    }
  }
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return size_i;
}

Assistant:

size_t fread( void * _PDCLIB_restrict ptr, size_t size, size_t nmemb, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    char * dest = ( char * )ptr;
    size_t nmemb_i = 0;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepread( stream ) != EOF )
    {
        for ( nmemb_i = 0; nmemb_i < nmemb; ++nmemb_i )
        {
            size_t size_i;

            /* TODO: For better performance, move from stream buffer
               to destination block-wise, not byte-wise.
            */
            for ( size_i = 0; size_i < size; ++size_i )
            {
                if ( _PDCLIB_CHECKBUFFER( stream ) == EOF )
                {
                    /* Could not read requested data */
                    _PDCLIB_UNLOCK( stream->mtx );
                    return nmemb_i;
                }

                dest[ nmemb_i * size + size_i ] = _PDCLIB_GETC( stream );
            }
        }
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return nmemb_i;
}